

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_discharge(FuncState *fs,ExpDesc *e)

{
  uint reg;
  BCReg BVar1;
  BCPos BVar2;
  uint local_1c;
  BCReg rc;
  BCIns ins;
  ExpDesc *e_local;
  FuncState *fs_local;
  
  if (e->k == VUPVAL) {
    local_1c = (e->u).s.info << 0x10 | 0x2d;
  }
  else if (e->k == VGLOBAL) {
    BVar1 = const_str(fs,e);
    local_1c = BVar1 << 0x10 | 0x36;
  }
  else {
    if (e->k != VINDEXED) {
      if (e->k == VCALL) {
        (e->u).s.info = (e->u).s.aux;
        e->k = VNONRELOC;
        return;
      }
      if (e->k != VLOCAL) {
        return;
      }
      e->k = VNONRELOC;
      return;
    }
    reg = (e->u).s.aux;
    if ((int)reg < 0) {
      local_1c = (e->u).s.info << 0x18 | 0x39 | (reg ^ 0xffffffff) << 0x10;
    }
    else if (reg < 0x100) {
      bcreg_free(fs,reg);
      local_1c = (e->u).s.info << 0x18 | 0x38 | reg << 0x10;
    }
    else {
      local_1c = (e->u).s.info << 0x18 | 0x3a | (reg - 0x100) * 0x10000;
    }
    bcreg_free(fs,(e->u).s.info);
  }
  BVar2 = bcemit_INS(fs,local_1c);
  (e->u).s.info = BVar2;
  e->k = VRELOCABLE;
  return;
}

Assistant:

static void expr_discharge(FuncState *fs, ExpDesc *e)
{
  BCIns ins;
  if (e->k == VUPVAL) {
    ins = BCINS_AD(BC_UGET, 0, e->u.s.info);
  } else if (e->k == VGLOBAL) {
    ins = BCINS_AD(BC_GGET, 0, const_str(fs, e));
  } else if (e->k == VINDEXED) {
    BCReg rc = e->u.s.aux;
    if ((int32_t)rc < 0) {
      ins = BCINS_ABC(BC_TGETS, 0, e->u.s.info, ~rc);
    } else if (rc > BCMAX_C) {
      ins = BCINS_ABC(BC_TGETB, 0, e->u.s.info, rc-(BCMAX_C+1));
    } else {
      bcreg_free(fs, rc);
      ins = BCINS_ABC(BC_TGETV, 0, e->u.s.info, rc);
    }
    bcreg_free(fs, e->u.s.info);
  } else if (e->k == VCALL) {
    e->u.s.info = e->u.s.aux;
    e->k = VNONRELOC;
    return;
  } else if (e->k == VLOCAL) {
    e->k = VNONRELOC;
    return;
  } else {
    return;
  }
  e->u.s.info = bcemit_INS(fs, ins);
  e->k = VRELOCABLE;
}